

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O2

void __thiscall
CVmObjCharSet::restore_from_file
          (CVmObjCharSet *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_3)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong buflen;
  char buf [128];
  char acStack_a8 [128];
  
  uVar2 = CVmFile::read_uint2(fp);
  uVar1 = 0x80;
  if (uVar2 < 0x80) {
    uVar1 = uVar2;
  }
  buflen = (ulong)uVar1;
  CVmFile::read_bytes(fp,acStack_a8,buflen);
  if (0x80 < uVar2) {
    lVar3 = CVmFile::get_pos(fp);
    CVmFile::set_pos(fp,(uVar2 - buflen) + lVar3);
  }
  alloc_ext(this,acStack_a8,buflen);
  return;
}

Assistant:

void CVmObjCharSet::restore_from_file(VMG_ vm_obj_id_t self,
                                      CVmFile *fp, CVmObjFixup *)
{
    char buf[128];
    size_t len;
    size_t read_len;

    /* read the length of the character set name */
    len = fp->read_uint2();

    /* limit the reading to the length of the buffer */
    read_len = len;
    if (read_len > sizeof(buf))
        read_len = sizeof(buf);

    /* read the name, up to the buffer length */
    fp->read_bytes(buf, read_len);

    /* skip any bytes we couldn't fit in the buffer */
    if (len > read_len)
        fp->set_pos(fp->get_pos() + len - read_len);

    /* initialize from the saved data */
    alloc_ext(vmg_ buf, read_len);
}